

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanKey(Scanner *this)

{
  uint ToColumn;
  StringRef local_60;
  undefined1 local_50 [8];
  Token T;
  Scanner *this_local;
  
  if (this->FlowLevel == 0) {
    ToColumn = this->Column;
    T.Value.field_2._8_8_ =
         AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
         ::end(&this->TokenQueue);
    rollIndent(this,ToColumn,TK_BlockMappingStart,(iterator)T.Value.field_2._8_8_);
  }
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = this->FlowLevel == 0;
  Token::Token((Token *)local_50);
  local_50._0_4_ = TK_Key;
  StringRef::StringRef(&local_60,this->Current,1);
  T._0_8_ = local_60.Data;
  T.Range.Data = (char *)local_60.Length;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_50);
  Token::~Token((Token *)local_50);
  return true;
}

Assistant:

bool Scanner::scanKey() {
  if (!FlowLevel)
    rollIndent(Column, Token::TK_BlockMappingStart, TokenQueue.end());

  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = !FlowLevel;

  Token T;
  T.Kind = Token::TK_Key;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}